

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

Vector3D * __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::
StartVectorOfStructs<Geometry::Vector3D,flatbuffers::Offset>
          (FlatBufferBuilderImpl<false> *this,size_t vector_size)

{
  Vector3D *pVVar1;
  
  StartVector<flatbuffers::Offset,unsigned_int>(this,vector_size,0xc,4);
  pVVar1 = (Vector3D *)vector_downward<unsigned_int>::make_space(&this->buf_,vector_size * 0xc);
  return pVVar1;
}

Assistant:

T *StartVectorOfStructs(size_t vector_size) {
    StartVector<OffsetT>(vector_size, sizeof(T), AlignOf<T>());
    return reinterpret_cast<T *>(buf_.make_space(vector_size * sizeof(T)));
  }